

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceCacheGL.hpp
# Opt level: O2

void __thiscall
Diligent::ShaderResourceCacheGL::SetDynamicSSBOOffset
          (ShaderResourceCacheGL *this,Uint32 CacheOffset,Uint32 DynamicOffset)

{
  CachedSSBO *pCVar1;
  string msg;
  string local_40;
  
  if ((this->m_DynamicSSBOSlotMask >> ((ulong)CacheOffset & 0x3f) & 1) == 0) {
    FormatString<char[61]>
              (&local_40,
               (char (*) [61])"Attempting to set dynamic offset for a non-dynamic SSBO slot");
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"SetDynamicSSBOOffset",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/ShaderResourceCacheGL.hpp"
               ,0xf4);
    std::__cxx11::string::~string((string *)&local_40);
  }
  pCVar1 = GetConstSSBO(this,CacheOffset);
  pCVar1->DynamicOffset = DynamicOffset;
  return;
}

Assistant:

void SetDynamicSSBOOffset(Uint32 CacheOffset, Uint32 DynamicOffset)
    {
        DEV_CHECK_ERR((m_DynamicSSBOSlotMask & (Uint64{1} << Uint64{CacheOffset})) != 0, "Attempting to set dynamic offset for a non-dynamic SSBO slot");
        GetSSBO(CacheOffset).DynamicOffset = DynamicOffset;
    }